

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O1

deUint8 __thiscall
deqp::gles31::Functional::anon_unknown_1::LineRenderCase::checkLineWidths
          (LineRenderCase *this,ConstPixelBufferAccess *access,IVec2 *begin,IVec2 *end,
          int componentNdx,int *messageLimitCounter)

{
  int iVar1;
  uint uVar2;
  int i;
  RenderTarget *pRVar3;
  long lVar4;
  int aiVar5 [2];
  byte bVar6;
  int x;
  int detectedLineWidth;
  bool bVar7;
  IVec2 cursor;
  IVec2 advance;
  IVec2 lineWidthRange;
  IVec2 local_90;
  int local_84;
  uint local_80 [2];
  undefined8 local_78;
  IVec2 local_6c;
  int local_64;
  LineRenderCase *local_60;
  int *local_58;
  ulong local_50;
  uint local_48;
  int local_44;
  int local_40 [4];
  
  local_58 = messageLimitCounter;
  pRVar3 = Context::getRenderTarget((this->super_BBoxRenderCase).super_TestCase.m_context);
  local_50 = 1;
  if (this->m_isWideLineCase != false) {
    local_50 = (ulong)(uint)this->m_wideLineLineWidth;
  }
  local_6c.m_data[0] = (int)local_50;
  local_84 = local_6c.m_data[0] + 1;
  local_6c.m_data[1] = local_6c.m_data[0];
  if (1 < pRVar3->m_numSamples) {
    local_6c.m_data[1] = local_84;
  }
  iVar1 = begin->m_data[0];
  bVar7 = iVar1 == end->m_data[0];
  local_80[1] = (uint)bVar7;
  local_80[0] = (uint)!bVar7;
  detectedLineWidth = 0;
  x = (int)access;
  local_60 = this;
  tcu::ConstPixelBufferAccess::getPixelInt
            ((ConstPixelBufferAccess *)local_40,x,iVar1,begin->m_data[1]);
  if (local_40[componentNdx] == 0) {
    bVar7 = false;
  }
  else {
    local_90.m_data[0] = 0;
    local_90.m_data[1] = 0;
    lVar4 = 0;
    do {
      local_90.m_data[lVar4] = begin->m_data[lVar4] - local_80[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 == 1);
    detectedLineWidth = 0;
    if (-1 < local_90.m_data[0]) {
      do {
        if (((long)local_90.m_data < 0) ||
           (tcu::ConstPixelBufferAccess::getPixelInt
                      ((ConstPixelBufferAccess *)local_40,x,local_90.m_data[0],local_90.m_data[1]),
           local_40[componentNdx] == 0)) break;
        lVar4 = 0;
        do {
          local_90.m_data[lVar4] = local_90.m_data[lVar4] - local_80[lVar4];
          lVar4 = lVar4 + 1;
        } while (lVar4 == 1);
        detectedLineWidth = detectedLineWidth + 1;
      } while (-1 < local_90.m_data[0]);
    }
    bVar7 = true;
  }
  local_50 = (ulong)((int)local_50 - 1);
  local_90 = *(IVec2 *)begin->m_data;
  local_44 = local_6c.m_data[0];
  local_64 = local_6c.m_data[1];
  local_48 = local_80[0];
  local_78 = 0;
  while( true ) {
    iVar1 = local_6c.m_data[1];
    uVar2 = local_80[0];
    if ((local_90.m_data[0] == end->m_data[0]) && (local_90.m_data[1] == end->m_data[1])) break;
    tcu::ConstPixelBufferAccess::getPixelInt
              ((ConstPixelBufferAccess *)local_40,x,local_90.m_data[0],local_90.m_data[1]);
    if (local_40[componentNdx] == 0) {
      if (detectedLineWidth != 0) {
        if (((detectedLineWidth < local_44) && (!bVar7)) || (local_64 < detectedLineWidth)) {
          if ((((int)local_50 <= detectedLineWidth) || (bVar6 = 8, bVar7)) &&
             (bVar6 = 8, detectedLineWidth <= local_84)) {
            bVar6 = 4;
          }
          local_78 = CONCAT71((int7)((ulong)local_78 >> 8),(byte)local_78 | bVar6);
          printLineWidthError(local_60,&local_90,detectedLineWidth,&local_6c,local_48 == 0,local_58)
          ;
        }
        bVar7 = false;
      }
      detectedLineWidth = 0;
    }
    else {
      detectedLineWidth = detectedLineWidth + 1;
    }
    lVar4 = 0;
    do {
      local_90.m_data[lVar4] = local_90.m_data[lVar4] + local_80[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 == 1);
  }
  if (detectedLineWidth != 0) {
    aiVar5 = *&end->m_data;
    local_90.m_data = aiVar5;
    if (aiVar5[0] < (access->m_size).m_data[0]) {
      do {
        if ((access->m_size).m_data[1] <= local_90.m_data[1]) break;
        tcu::ConstPixelBufferAccess::getPixelInt
                  ((ConstPixelBufferAccess *)local_40,x,aiVar5[0],local_90.m_data[1]);
        if (local_40[componentNdx] == 0) {
          if ((detectedLineWidth != 0) && (iVar1 < detectedLineWidth)) {
            local_78 = CONCAT71((int7)((ulong)local_78 >> 8),
                                (byte)local_78 | (local_84 < detectedLineWidth) * '\x04' + 4U);
            printLineWidthError(local_60,&local_90,detectedLineWidth,&local_6c,uVar2 == 0,local_58);
          }
          detectedLineWidth = 0;
        }
        else {
          detectedLineWidth = detectedLineWidth + 1;
        }
        lVar4 = 0;
        do {
          local_90.m_data[lVar4] = local_90.m_data[lVar4] + local_80[lVar4];
          lVar4 = lVar4 + 1;
        } while (lVar4 == 1);
        aiVar5 = local_90.m_data & 0xffffffff;
      } while (local_90.m_data[0] < (access->m_size).m_data[0]);
    }
    if (local_6c.m_data[1] < detectedLineWidth) {
      bVar6 = (local_84 < detectedLineWidth) * '\x04' + 4U | (byte)local_78;
      printLineWidthError(local_60,&local_90,detectedLineWidth,&local_6c,local_80[0] == 0,local_58);
      return bVar6;
    }
  }
  return (deUint8)local_78;
}

Assistant:

deUint8 LineRenderCase::checkLineWidths (const tcu::ConstPixelBufferAccess& access, const tcu::IVec2& begin, const tcu::IVec2& end, int componentNdx, int& messageLimitCounter) const
{
	const bool			multisample				= m_context.getRenderTarget().getNumSamples() > 1;
	const int			lineRenderWidth			= (m_isWideLineCase) ? (m_wideLineLineWidth) : 1;
	const tcu::IVec2	lineWidthRange			= (multisample)
													? (tcu::IVec2(lineRenderWidth, lineRenderWidth+1))	// multisampled "smooth" lines may spread to neighboring pixel
													: (tcu::IVec2(lineRenderWidth, lineRenderWidth));
	const tcu::IVec2	relaxedLineWidthRange	= (tcu::IVec2(lineRenderWidth-1, lineRenderWidth+1));

	int					lineWidth				= 0;
	bool				bboxLimitedLine			= false;
	deUint8				errorMask				= 0;

	const tcu::IVec2	advance					= (begin.x() == end.x()) ? (tcu::IVec2(0, 1)) : (tcu::IVec2(1, 0));

	// fragments before begin?
	if (access.getPixelInt(begin.x(), begin.y())[componentNdx] != 0)
	{
		bboxLimitedLine = true;

		for (tcu::IVec2 cursor = begin - advance;; cursor -= advance)
		{
			if (cursor.x() < 0 || cursor.y() < 0)
			{
				break;
			}
			else if (access.getPixelInt(cursor.x(), cursor.y())[componentNdx] != 0)
			{
				++lineWidth;
			}
			else
				break;
		}
	}

	for (tcu::IVec2 cursor = begin; cursor != end; cursor += advance)
	{
		const bool hit = (access.getPixelInt(cursor.x(), cursor.y())[componentNdx] != 0);

		if (hit)
			++lineWidth;
		else if (lineWidth)
		{
			// Line is allowed to be be thinner if it borders the bbox boundary (since part of the line might have been discarded).
			const bool incorrectLineWidth = (lineWidth < lineWidthRange.x() && !bboxLimitedLine) || (lineWidth > lineWidthRange.y());

			if (incorrectLineWidth)
			{
				const bool incorrectRelaxedLineWidth = (lineWidth < relaxedLineWidthRange.x() && !bboxLimitedLine) || (lineWidth > relaxedLineWidthRange.y());

				if (incorrectRelaxedLineWidth)
					errorMask |= SCANRESULT_LINE_WIDTH_ERR_BIT;
				else
					errorMask |= SCANRESULT_LINE_WIDTH_WARN_BIT;

				printLineWidthError(cursor, lineWidth, lineWidthRange, advance.x() == 0, messageLimitCounter);
			}

			lineWidth = 0;
			bboxLimitedLine = false;
		}
	}

	// fragments after end?
	if (lineWidth)
	{
		for (tcu::IVec2 cursor = end;; cursor += advance)
		{
			if (cursor.x() >= access.getWidth() || cursor.y() >= access.getHeight())
			{
				if (lineWidth > lineWidthRange.y())
				{
					if (lineWidth > relaxedLineWidthRange.y())
						errorMask |= SCANRESULT_LINE_WIDTH_ERR_BIT;
					else
						errorMask |= SCANRESULT_LINE_WIDTH_WARN_BIT;

					printLineWidthError(cursor, lineWidth, lineWidthRange, advance.x() == 0, messageLimitCounter);
				}

				break;
			}
			else if (access.getPixelInt(cursor.x(), cursor.y())[componentNdx] != 0)
			{
				++lineWidth;
			}
			else if (lineWidth)
			{
				// only check that line width is not larger than expected. Line width may be smaller
				// since the scanning 'cursor' is now outside the bounding box.
				const bool incorrectLineWidth = (lineWidth > lineWidthRange.y());

				if (incorrectLineWidth)
				{
					const bool incorrectRelaxedLineWidth = (lineWidth > relaxedLineWidthRange.y());

					if (incorrectRelaxedLineWidth)
						errorMask |= SCANRESULT_LINE_WIDTH_ERR_BIT;
					else
						errorMask |= SCANRESULT_LINE_WIDTH_WARN_BIT;

					printLineWidthError(cursor, lineWidth, lineWidthRange, advance.x() == 0, messageLimitCounter);
				}

				lineWidth = 0;
			}
		}
	}

	return errorMask;
}